

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  FieldGenerator *pFVar4;
  Descriptor *pDVar5;
  int iVar6;
  uint i;
  uint extraout_EDX;
  long extraout_RDX;
  FieldDescriptor *field;
  long lVar7;
  long lVar8;
  FieldDescriptor *pFVar9;
  ulong uVar10;
  string local_58;
  FieldGeneratorMap *local_38;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x58) == '\x01') {
    io::Printer::Print(printer,
                       "int $classname$::ByteSize() const {\n  int total_size = _extensions_.MessageSetByteSize();\n"
                       ,"classname",&this->classname_);
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
      io::Printer::Print(printer,
                         "  total_size += ::google::protobuf::internal::WireFormat::\n      ComputeUnknownMessageSetItemsSize(unknown_fields());\n"
                        );
    }
    io::Printer::Print(printer,
                       "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n  _cached_size_ = total_size;\n  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n  return total_size;\n}\n"
                      );
    return;
  }
  io::Printer::Print(printer,"int $classname$::ByteSize() const {\n","classname",&this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int total_size = 0;\n\n");
  pDVar5 = this->descriptor_;
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    local_38 = &this->field_generators_;
    iVar6 = -1;
    lVar8 = 0;
    uVar10 = 0;
    lVar7 = extraout_RDX;
    do {
      i = (uint)lVar7;
      lVar7 = *(long *)(pDVar5 + 0x30);
      if (*(int *)(lVar7 + 0x30 + lVar8) != 3) {
        iVar2 = iVar6 + 7;
        if (iVar6 >= 0) {
          iVar2 = iVar6;
        }
        if ((iVar6 < 0) || (i = (uint)(uVar10 >> 3) & 0x1fffffff, i != iVar2 >> 3)) {
          if (-1 < iVar6) {
            io::Printer::Outdent(printer);
            io::Printer::Print(printer,"}\n");
            i = extraout_EDX;
          }
          if (*(char *)(lVar7 + 0x34 + lVar8) == '\0') {
            plVar3 = (long *)(*(long *)(lVar7 + 0x38 + lVar8) + 0x30);
          }
          else {
            lVar1 = *(long *)(lVar7 + 0x40 + lVar8);
            if (lVar1 == 0) {
              plVar3 = (long *)(*(long *)(lVar7 + 0x20 + lVar8) + 0x80);
            }
            else {
              plVar3 = (long *)(lVar1 + 0x70);
            }
          }
          SimpleItoa_abi_cxx11_
                    (&local_58,
                     (protobuf *)
                     (ulong)(uint)((int)((ulong)((lVar7 - *plVar3) + lVar8) >> 3) * -0x11111111),i);
          io::Printer::Print(printer,"if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n"
                             ,"index",&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          io::Printer::Indent(printer);
        }
        pFVar9 = (FieldDescriptor *)(lVar7 + lVar8);
        anon_unknown_0::PrintFieldComment(printer,pFVar9);
        FieldName_abi_cxx11_(&local_58,(cxx *)pFVar9,field);
        io::Printer::Print(printer,"if (has_$name$()) {\n","name",&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        io::Printer::Indent(printer);
        pFVar4 = FieldGeneratorMap::get(local_38,pFVar9);
        (*pFVar4->_vptr_FieldGenerator[0x11])(pFVar4,printer);
        io::Printer::Outdent(printer);
        io::Printer::Print(printer,"}\n\n");
        pDVar5 = this->descriptor_;
        iVar6 = (int)uVar10;
      }
      uVar10 = uVar10 + 1;
      lVar7 = (long)*(int *)(pDVar5 + 0x2c);
      lVar8 = lVar8 + 0x78;
    } while ((long)uVar10 < lVar7);
    if (-1 < iVar6) {
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"}\n");
      pDVar5 = this->descriptor_;
    }
  }
  if (0 < *(int *)(pDVar5 + 0x2c)) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      if (*(int *)(*(long *)(pDVar5 + 0x30) + 0x30 + lVar7) == 3) {
        pFVar9 = (FieldDescriptor *)(*(long *)(pDVar5 + 0x30) + lVar7);
        anon_unknown_0::PrintFieldComment(printer,pFVar9);
        pFVar4 = FieldGeneratorMap::get(&this->field_generators_,pFVar9);
        (*pFVar4->_vptr_FieldGenerator[0x11])(pFVar4,printer);
        io::Printer::Print(printer,"\n");
        pDVar5 = this->descriptor_;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x78;
    } while (lVar8 < *(int *)(pDVar5 + 0x2c));
  }
  if (0 < *(int *)(pDVar5 + 0x58)) {
    io::Printer::Print(printer,"total_size += _extensions_.ByteSize();\n\n");
    pDVar5 = this->descriptor_;
  }
  if (*(int *)(*(long *)(*(long *)(pDVar5 + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"if (!unknown_fields().empty()) {\n");
    io::Printer::Indent(printer);
    io::Printer::Print(printer,
                       "total_size +=\n  ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n    unknown_fields());\n"
                      );
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  io::Printer::Print(printer,
                     "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n_cached_size_ = total_size;\nGOOGLE_SAFE_CONCURRENT_WRITES_END();\nreturn total_size;\n"
                    );
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateByteSize(io::Printer* printer) {
  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    printer->Print(
      "int $classname$::ByteSize() const {\n"
      "  int total_size = _extensions_.MessageSetByteSize();\n",
      "classname", classname_);
    if (HasUnknownFields(descriptor_->file())) {
      printer->Print(
        "  total_size += ::google::protobuf::internal::WireFormat::\n"
        "      ComputeUnknownMessageSetItemsSize(unknown_fields());\n");
    }
    printer->Print(
      "  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
      "  _cached_size_ = total_size;\n"
      "  GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
      "  return total_size;\n"
      "}\n");
    return;
  }

  printer->Print(
    "int $classname$::ByteSize() const {\n",
    "classname", classname_);
  printer->Indent();
  printer->Print(
    "int total_size = 0;\n"
    "\n");

  int last_index = -1;

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (!field->is_repeated()) {
      // See above in GenerateClear for an explanation of this.
      // TODO(kenton):  Share code?  Unclear how to do so without
      //   over-engineering.
      if ((i / 8) != (last_index / 8) ||
          last_index < 0) {
        if (last_index >= 0) {
          printer->Outdent();
          printer->Print("}\n");
        }
        printer->Print(
          "if (_has_bits_[$index$ / 32] & (0xffu << ($index$ % 32))) {\n",
          "index", SimpleItoa(field->index()));
        printer->Indent();
      }
      last_index = i;

      PrintFieldComment(printer, field);

      printer->Print(
        "if (has_$name$()) {\n",
        "name", FieldName(field));
      printer->Indent();

      field_generators_.get(field).GenerateByteSize(printer);

      printer->Outdent();
      printer->Print(
        "}\n"
        "\n");
    }
  }

  if (last_index >= 0) {
    printer->Outdent();
    printer->Print("}\n");
  }

  // Repeated fields don't use _has_bits_ so we count them in a separate
  // pass.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->is_repeated()) {
      PrintFieldComment(printer, field);
      field_generators_.get(field).GenerateByteSize(printer);
      printer->Print("\n");
    }
  }

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "total_size += _extensions_.ByteSize();\n"
      "\n");
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print("if (!unknown_fields().empty()) {\n");
    printer->Indent();
    printer->Print(
      "total_size +=\n"
      "  ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(\n"
      "    unknown_fields());\n");
    printer->Outdent();
    printer->Print("}\n");
  }

  // We update _cached_size_ even though this is a const method.  In theory,
  // this is not thread-compatible, because concurrent writes have undefined
  // results.  In practice, since any concurrent writes will be writing the
  // exact same value, it works on all common processors.  In a future version
  // of C++, _cached_size_ should be made into an atomic<int>.
  printer->Print(
    "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
    "_cached_size_ = total_size;\n"
    "GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
    "return total_size;\n");

  printer->Outdent();
  printer->Print("}\n");
}